

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ints.cpp
# Opt level: O0

void test_limits<bool>(void)

{
  bool bVar1;
  ostream *poVar2;
  bool local_1e2;
  bool local_1e1;
  format local_1e0 [8];
  string actual;
  string local_1c0 [8];
  string expected;
  stringstream local_190 [8];
  stringstream str;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  bVar1 = std::numeric_limits<bool>::min();
  poVar2 = (ostream *)std::ostream::operator<<(local_180,bVar1);
  poVar2 = std::operator<<(poVar2," ");
  bVar1 = std::numeric_limits<bool>::max();
  std::ostream::operator<<(poVar2,bVar1);
  std::__cxx11::stringstream::str();
  local_1e1 = std::numeric_limits<bool>::min();
  local_1e2 = std::numeric_limits<bool>::max();
  format::string<std::__cxx11::string,char_const[8],bool,bool>
            (local_1e0,(char (*) [8])"{0} {1}",&local_1e1,&local_1e2);
  poVar2 = std::operator<<((ostream *)&std::cout,local_1c0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,(string *)local_1e0);
  std::operator<<(poVar2,"\n");
  expect_eq<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]format/tests/ints.cpp",
             0x1b);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void test_limits() {
  std::stringstream str;
  str << std::numeric_limits<T>::min() << " "
      << std::numeric_limits<T>::max();

  std::string expected = str.str();
  std::string actual =
    format::string("{0} {1}",
                   std::numeric_limits<T>::min(),
                   std::numeric_limits<T>::max());

  std::cout << expected << "\n"
            << actual << "\n";

  EXPECT_EQ(expected, actual);
}